

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FragDataIndexingCase::iterate(FragDataIndexingCase *this)

{
  void **ppvVar1;
  code *pcVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 uVar8;
  RGBA expectedColor;
  RenderContext *renderCtx_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestLog *pTVar9;
  TestError *this_00;
  NotSupportedError *this_01;
  undefined4 extraout_var_02;
  PixelFormat *this_02;
  char *description;
  VertexArrayBinding *local_590;
  PixelBufferAccess local_468;
  undefined1 local_43d;
  RGBA local_43c;
  RGBA RStack_438;
  bool isOk;
  RGBA local_434;
  undefined1 local_430 [4];
  RGBA threshold;
  Surface result;
  allocator<char> local_3f9;
  string local_3f8;
  undefined1 local_3d2;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  void **local_360;
  undefined1 local_358 [8];
  VertexArrayBinding vertexArrays [3];
  deUint8 local_260 [8];
  deUint8 indices [6];
  float indexValues [4];
  float colors [16];
  float positions [8];
  int viewportH;
  int viewportW;
  ProgramSources local_1c8;
  undefined1 local_f8 [8];
  ShaderProgram program;
  Functions *gl;
  RenderContext *renderCtx;
  FragDataIndexingCase *this_local;
  
  renderCtx_00 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*renderCtx_00->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar5);
  genSources(&local_1c8,this->m_indexExprType);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f8,renderCtx_00,&local_1c8);
  glu::ProgramSources::~ProgramSources(&local_1c8);
  iVar5 = (*renderCtx_00->_vptr_RenderContext[4])();
  iVar5 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_00,iVar5));
  iVar5 = de::min<int>(iVar5,0x80);
  iVar6 = (*renderCtx_00->_vptr_RenderContext[4])();
  iVar6 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_01,iVar6));
  iVar6 = de::min<int>(iVar6,0x80);
  colors[0xe] = -1.0;
  colors[0xf] = -1.0;
  colors[10] = 0.0;
  colors[0xb] = 1.0;
  colors[0xc] = 0.0;
  colors[0xd] = 1.0;
  colors[6] = 0.0;
  colors[7] = 1.0;
  colors[8] = 0.0;
  colors[9] = 1.0;
  colors[2] = 0.0;
  colors[3] = 1.0;
  colors[4] = 0.0;
  colors[5] = 1.0;
  indexValues[2] = 0.0;
  indexValues[3] = 1.0;
  colors[0] = 0.0;
  colors[1] = 1.0;
  _indices = 0;
  indexValues[0] = 0.0;
  indexValues[1] = 0.0;
  local_260[4] = '\x01';
  local_260[5] = '\x03';
  local_260[0] = '\0';
  local_260[1] = '\x01';
  local_260[2] = '\x02';
  local_260[3] = '\x02';
  local_3d2 = 1;
  local_360 = (void **)local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"a_position",&local_381);
  glu::va::Float((VertexArrayBinding *)local_358,&local_380,2,4,0,colors + 0xe);
  ppvVar1 = &vertexArrays[0].pointer.data;
  local_360 = ppvVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"a_color",&local_3a9);
  glu::va::Float((VertexArrayBinding *)ppvVar1,&local_3a8,4,4,0,indexValues + 2);
  ppvVar1 = &vertexArrays[1].pointer.data;
  local_360 = ppvVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"a_index",&local_3d1);
  glu::va::Float((VertexArrayBinding *)ppvVar1,&local_3d0,1,4,0,(float *)indices);
  local_3d2 = 0;
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar9,(ShaderProgram *)local_f8);
  bVar4 = glu::ShaderProgram::isOk((ShaderProgram *)local_f8);
  if (bVar4) {
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x1c0))(0x3f800000,0);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x188))(0x4500);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x1a00))(0,0,iVar5,iVar6);
    pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
    dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
    (*pcVar2)(dVar7);
    pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x14f0);
    pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0xb48);
    dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
    uVar8 = (*pcVar3)(dVar7,"u_index");
    (*pcVar2)(uVar8,0);
    dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
    glu::pr::Triangles((PrimitiveList *)&result.m_pixels.m_cap,6,local_260);
    glu::draw(renderCtx_00,dVar7,3,(VertexArrayBinding *)local_358,
              (PrimitiveList *)&result.m_pixels.m_cap,(DrawUtilCallback *)0x0);
    dVar7 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
    glu::checkError(dVar7,"Rendering failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0xc5);
    tcu::Surface::Surface((Surface *)local_430,iVar5,iVar6);
    iVar5 = (*renderCtx_00->_vptr_RenderContext[4])();
    this_02 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar5));
    RStack_438 = tcu::PixelFormat::getColorThreshold(this_02);
    tcu::RGBA::RGBA(&local_43c,1,1,1,1);
    local_434 = tcu::operator+(&stack0xfffffffffffffbc8,&local_43c);
    tcu::Surface::getAccess(&local_468,(Surface *)local_430);
    glu::readPixels(renderCtx_00,0,0,&local_468);
    dVar7 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
    glu::checkError(dVar7,"Reading pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0xcd);
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    expectedColor = tcu::RGBA::green();
    local_43d = compareSingleColor(pTVar9,(Surface *)local_430,expectedColor,local_434);
    description = "Image comparison failed";
    if ((bool)local_43d) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~local_43d & QP_TEST_RESULT_FAIL,description);
    tcu::Surface::~Surface((Surface *)local_430);
    local_590 = (VertexArrayBinding *)&vertexArrays[2].pointer.data;
    do {
      local_590 = local_590 + -1;
      glu::VertexArrayBinding::~VertexArrayBinding(local_590);
    } while (local_590 != (VertexArrayBinding *)local_358);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f8);
    return STOP;
  }
  if (this->m_indexExprType == INDEX_EXPR_STATIC) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
               ,0xb7);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"Dynamic indexing of gl_FragData[] not supported",&local_3f9);
  tcu::NotSupportedError::NotSupportedError(this_01,&local_3f8);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
		const glw::Functions&			gl				= renderCtx.getFunctions();
		const glu::ShaderProgram		program			(renderCtx, genSources(m_indexExprType));
		const int						viewportW		= de::min(renderCtx.getRenderTarget().getWidth(), 128);
		const int						viewportH		= de::min(renderCtx.getRenderTarget().getHeight(), 128);

		const float positions[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, +1.0f
		};
		const float colors[] =
		{
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f
		};
		const float		indexValues[]	= { 0.0f, 0.0f, 0.0f, 0.0f };
		const deUint8	indices[]		= { 0, 1, 2, 2, 1, 3 };

		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	2, 4, 0, &positions[0]),
			glu::va::Float("a_color",		4, 4, 0, &colors[0]),
			glu::va::Float("a_index",		1, 4, 0, &indexValues[0])
		};

		m_testCtx.getLog() << program;

		if (!program.isOk())
		{
			if (m_indexExprType == INDEX_EXPR_STATIC)
				TCU_FAIL("Compile failed");
			else
				throw tcu::NotSupportedError("Dynamic indexing of gl_FragData[] not supported");
		}

		gl.clearColor	(1.0f, 0.0f, 0.0f, 1.0f);
		gl.clear		(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		gl.viewport		(0, 0, viewportW, viewportH);
		gl.useProgram	(program.getProgram());
		gl.uniform1i	(gl.getUniformLocation(program.getProgram(), "u_index"), 0);

		glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

		{
			tcu::Surface		result		(viewportW, viewportH);
			const tcu::RGBA		threshold	= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
			bool				isOk;

			glu::readPixels(renderCtx, 0, 0, result.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

			isOk = compareSingleColor(m_testCtx.getLog(), result, tcu::RGBA::green(), threshold);

			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}